

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool op_s_rri_rot(DisasContext_conflict1 *s,arg_s_rri_rot *a,
                  _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_conflict1 *gen,int logic_cc,
                  StoreRegKind kind)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t val;
  TCGv_i32 arg;
  TCGv_i32 var;
  uint32_t imm;
  TCGv_i32 tmp2;
  TCGv_i32 tmp1;
  TCGContext_conflict1 *tcg_ctx;
  StoreRegKind kind_local;
  int logic_cc_local;
  _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_conflict1 *gen_local;
  arg_s_rri_rot *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  val = ror32(a->imm,a->rot);
  if ((logic_cc != 0) && (a->rot != 0)) {
    tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->cpu_CF,val >> 0x1f);
  }
  arg = tcg_const_i32_aarch64(tcg_ctx_00,val);
  var = load_reg(s,a->rn);
  (*gen)(tcg_ctx_00,var,var,arg);
  tcg_temp_free_i32(tcg_ctx_00,arg);
  if (logic_cc != 0) {
    gen_logic_CC(tcg_ctx_00,var);
  }
  _Var1 = store_reg_kind(s,a->rd,var,kind);
  return _Var1;
}

Assistant:

static bool op_s_rri_rot(DisasContext *s, arg_s_rri_rot *a,
                         void (*gen)(TCGContext *, TCGv_i32, TCGv_i32, TCGv_i32),
                         int logic_cc, StoreRegKind kind)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp1, tmp2;
    uint32_t imm;

    imm = ror32(a->imm, a->rot);
    if (logic_cc && a->rot) {
        tcg_gen_movi_i32(tcg_ctx, tcg_ctx->cpu_CF, imm >> 31);
    }
    tmp2 = tcg_const_i32(tcg_ctx, imm);
    tmp1 = load_reg(s, a->rn);

    gen(tcg_ctx, tmp1, tmp1, tmp2);
    tcg_temp_free_i32(tcg_ctx, tmp2);

    if (logic_cc) {
        gen_logic_CC(tcg_ctx, tmp1);
    }
    return store_reg_kind(s, a->rd, tmp1, kind);
}